

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O2

natwm_error workspace_list_switch_to_workspace(natwm_state *state,size_t index)

{
  workspace *next_workspace;
  natwm_error nVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  
  if ((index < state->workspace_list->count) &&
     (next_workspace = state->workspace_list->workspaces[index], next_workspace != (workspace *)0x0)
     ) {
    if (next_workspace->is_focused == false) {
      nVar1 = workspace_change_monitor(state,next_workspace);
      return nVar1;
    }
    nVar1 = NO_ERROR;
  }
  else {
    internal_logger(natwm_logger,LEVEL_WARNING,"Attempted to switch to non-existent workspace %u",
                    index,in_R8,in_R9,0x10923c);
    nVar1 = INVALID_INPUT_ERROR;
  }
  return nVar1;
}

Assistant:

enum natwm_error workspace_list_switch_to_workspace(struct natwm_state *state, size_t index)
{
        struct workspace *next_workspace
                = workspace_list_get_workspace(state->workspace_list, index);

        if (!next_workspace) {
                LOG_WARNING(
                        natwm_logger, "Attempted to switch to non-existent workspace %u", index);

                return INVALID_INPUT_ERROR;
        }

        if (next_workspace->is_focused) {
                return NO_ERROR;
        }

        return workspace_change_monitor(state, next_workspace);
}